

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Config::Config(Config *this,ConfigData *data)

{
  pointer pbVar1;
  IStream *pIVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  pointer pbVar3;
  iterator __end2;
  TestSpecParser parser;
  TestSpec local_148;
  undefined1 local_118 [32];
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  pointer local_98;
  pointer puStack_90;
  pointer local_88;
  pointer psStack_80;
  pointer local_78;
  pointer psStack_70;
  pointer local_68;
  pointer pFStack_60;
  pointer local_58;
  pointer pbStack_50;
  pointer local_48;
  pointer pbStack_40;
  ITagAliasRegistry *local_38;
  
  (this->super_IConfig).super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__Config_00201ff0;
  ConfigData::ConfigData(&this->m_data,data);
  pIVar2 = openStream(this);
  (this->m_stream)._M_t.
  super___uniq_ptr_impl<const_Catch::IStream,_std::default_delete<const_Catch::IStream>_>._M_t.
  super__Tuple_impl<0UL,_const_Catch::IStream_*,_std::default_delete<const_Catch::IStream>_>.
  super__Head_base<0UL,_const_Catch::IStream_*,_false>._M_head_impl = pIVar2;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_testSpec).m_filters.
  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_testSpec).m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_testSpec).m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_testSpec).m_invalidArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_hasTestFilters = false;
  pbVar1 = (this->m_data).testsOrTags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->m_data).testsOrTags.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1;
      pbVar3 = (pointer)((string *)pbVar3 + 1)) {
    trim((string *)local_118,(string *)pbVar3);
    std::__cxx11::string::operator=((string *)pbVar3,(string *)local_118);
    std::__cxx11::string::~string((string *)local_118);
  }
  pbVar1 = (this->m_data).sectionsToRun.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->m_data).sectionsToRun.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1;
      pbVar3 = (pointer)((string *)pbVar3 + 1)) {
    trim((string *)local_118,(string *)pbVar3);
    std::__cxx11::string::operator=((string *)pbVar3,(string *)local_118);
    std::__cxx11::string::~string((string *)local_118);
  }
  local_38 = ITagAliasRegistry::get();
  local_f8._M_p = (pointer)&local_e8;
  local_118._0_8_ = (pointer)0x0;
  local_118[8] = false;
  local_118._16_8_ = 0;
  local_118._24_8_ = 0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98 = (pointer)0x0;
  puStack_90 = (pointer)0x0;
  local_88 = (pointer)0x0;
  psStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  psStack_70 = (pointer)0x0;
  local_68 = (pointer)0x0;
  pFStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  pbStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  pbStack_40 = (pointer)0x0;
  pbVar3 = (this->m_data).testsOrTags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->m_data).testsOrTags.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar1) {
    this->m_hasTestFilters = true;
    for (; pbVar3 != pbVar1; pbVar3 = (pointer)((string *)pbVar3 + 1)) {
      TestSpecParser::parse((TestSpecParser *)local_118,(string *)pbVar3);
    }
  }
  TestSpecParser::testSpec(&local_148,(TestSpecParser *)local_118);
  TestSpec::operator=(&this->m_testSpec,&local_148);
  TestSpec::~TestSpec(&local_148);
  TestSpecParser::~TestSpecParser((TestSpecParser *)local_118);
  return;
}

Assistant:

Config::Config( ConfigData const& data )
    :   m_data( data ),
        m_stream( openStream() )
    {
        // We need to trim filter specs to avoid trouble with superfluous
        // whitespace (esp. important for bdd macros, as those are manually
        // aligned with whitespace).

        for (auto& elem : m_data.testsOrTags) {
            elem = trim(elem);
        }
        for (auto& elem : m_data.sectionsToRun) {
            elem = trim(elem);
        }

        TestSpecParser parser(ITagAliasRegistry::get());
        if (!m_data.testsOrTags.empty()) {
            m_hasTestFilters = true;
            for (auto const& testOrTags : m_data.testsOrTags) {
                parser.parse(testOrTags);
            }
        }
        m_testSpec = parser.testSpec();
    }